

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorwiseOp.h
# Opt level: O2

void __thiscall
Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::normalize
          (VectorwiseOp<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *this)

{
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,_const_Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_Eigen::internal::member_norm<double>,_1>,_1,_3>_>
  local_40;
  
  normalized(&local_40,this);
  PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
  lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,3,0,_1,3>const,Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,3,0,_1,3>,Eigen::internal::member_norm<double>,1>,1,3>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)this->m_matrix,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,_const_Eigen::Replicate<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_Eigen::internal::member_norm<double>,_1>,_1,_3>_>_>
              *)&local_40);
  free(local_40.m_rhs.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  return;
}

Assistant:

void normalize() {
      m_matrix = this->normalized();
    }